

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

pair<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::iterator,_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::iterator>
* __thiscall
google::protobuf::
Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
equal_range<google::protobuf::internal::(anonymous_namespace)::CustomStringView>
          (pair<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::iterator,_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::iterator>
           *__return_storage_ptr__,
          Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
          *this,key_arg<google::protobuf::internal::(anonymous_namespace)::CustomStringView> *key)

{
  bool bVar1;
  undefined1 local_60 [8];
  iterator begin;
  undefined1 local_30 [8];
  iterator it;
  key_arg<google::protobuf::internal::(anonymous_namespace)::CustomStringView> *key_local;
  Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  *this_local;
  
  it.super_UntypedMapIterator._16_8_ = key;
  find<google::protobuf::internal::(anonymous_namespace)::CustomStringView>
            ((iterator *)local_30,this,key);
  end((iterator *)&begin.super_UntypedMapIterator.bucket_index_,this);
  bVar1 = protobuf::operator==
                    ((iterator *)local_30,(iterator *)&begin.super_UntypedMapIterator.bucket_index_)
  ;
  if (bVar1) {
    std::
    pair<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::iterator,_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::iterator>
    ::
    pair<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::iterator_&,_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::iterator_&,_true>
              (__return_storage_ptr__,(iterator *)local_30,(iterator *)local_30);
  }
  else {
    iterator::operator++((iterator *)local_60,(iterator *)local_30,0);
    std::
    pair<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::iterator,_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::iterator>
    ::
    pair<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::iterator_&,_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::iterator_&,_true>
              (__return_storage_ptr__,(iterator *)local_60,(iterator *)local_30);
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, iterator> equal_range(const key_arg<K>& key)
      ABSL_ATTRIBUTE_LIFETIME_BOUND {
    iterator it = find(key);
    if (it == end()) {
      return std::pair<iterator, iterator>(it, it);
    } else {
      iterator begin = it++;
      return std::pair<iterator, iterator>(begin, it);
    }
  }